

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_avx2.c
# Opt level: O1

void av1_wiener_convolve_add_src_avx2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  undefined1 auVar12 [32];
  long lVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  ulong uVar16;
  uint8_t *puVar17;
  undefined1 (*pauVar18) [32];
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  uint8_t *puVar23;
  undefined2 uVar24;
  ushort uVar25;
  undefined4 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  int16_t im_block [1088];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined1 local_880 [16];
  undefined8 auStack_870 [264];
  
  lVar13 = (long)(h * 8 + 0x30);
  lVar20 = lVar13 * 2;
  *(undefined8 *)(local_880 + lVar20) = 0;
  *(undefined8 *)(local_880 + lVar20 + 8) = 0;
  *(undefined8 *)((long)auStack_870 + lVar20) = 0;
  *(undefined8 *)((long)auStack_870 + lVar20 + 8) = 0;
  lVar20 = lVar13 * 2;
  *(undefined8 *)(local_8a0 + lVar20) = 0;
  *(undefined8 *)(local_8a0 + lVar20 + 8) = 0;
  *(undefined8 *)(auStack_890 + lVar20) = 0;
  *(undefined8 *)(auStack_890 + lVar20 + 8) = 0;
  lVar20 = lVar13 * 2;
  *(undefined8 *)(local_8c0 + lVar20) = 0;
  *(undefined8 *)(local_8c0 + lVar20 + 8) = 0;
  *(undefined8 *)(auStack_8b0 + lVar20) = 0;
  *(undefined8 *)(auStack_8b0 + lVar20 + 8) = 0;
  lVar13 = lVar13 * 2;
  *(undefined8 *)(local_8e0 + lVar13) = 0;
  *(undefined8 *)(local_8e0 + lVar13 + 8) = 0;
  *(undefined8 *)(auStack_8d0 + lVar13) = 0;
  *(undefined8 *)(auStack_8d0 + lVar13 + 8) = 0;
  uVar3 = conv_params->round_0;
  cVar11 = (char)uVar3;
  cVar2 = (char)conv_params->round_1;
  if (0 < w) {
    auVar1 = *(undefined1 (*) [16])filter_x;
    auVar35 = vpshufb_avx(auVar1,_DAT_0052aca0);
    puVar14 = src + src_stride * -3 + -3;
    uVar24 = auVar35._0_2_;
    auVar33._2_2_ = uVar24;
    auVar33._0_2_ = uVar24;
    auVar33._4_2_ = uVar24;
    auVar33._6_2_ = uVar24;
    auVar33._8_2_ = uVar24;
    auVar33._10_2_ = uVar24;
    auVar33._12_2_ = uVar24;
    auVar33._14_2_ = uVar24;
    auVar33._16_2_ = uVar24;
    auVar33._18_2_ = uVar24;
    auVar33._20_2_ = uVar24;
    auVar33._22_2_ = uVar24;
    auVar33._24_2_ = uVar24;
    auVar33._26_2_ = uVar24;
    auVar33._28_2_ = uVar24;
    auVar33._30_2_ = uVar24;
    auVar35 = vpshufb_avx(auVar1,_DAT_0052ac00);
    uVar24 = auVar35._0_2_;
    auVar34._2_2_ = uVar24;
    auVar34._0_2_ = uVar24;
    auVar34._4_2_ = uVar24;
    auVar34._6_2_ = uVar24;
    auVar34._8_2_ = uVar24;
    auVar34._10_2_ = uVar24;
    auVar34._12_2_ = uVar24;
    auVar34._14_2_ = uVar24;
    auVar34._16_2_ = uVar24;
    auVar34._18_2_ = uVar24;
    auVar34._20_2_ = uVar24;
    auVar34._22_2_ = uVar24;
    auVar34._24_2_ = uVar24;
    auVar34._26_2_ = uVar24;
    auVar34._28_2_ = uVar24;
    auVar34._30_2_ = uVar24;
    auVar35 = vpshufb_avx(auVar1,_DAT_0052ac10);
    uVar24 = auVar35._0_2_;
    auVar36._2_2_ = uVar24;
    auVar36._0_2_ = uVar24;
    auVar36._4_2_ = uVar24;
    auVar36._6_2_ = uVar24;
    auVar36._8_2_ = uVar24;
    auVar36._10_2_ = uVar24;
    auVar36._12_2_ = uVar24;
    auVar36._14_2_ = uVar24;
    auVar36._16_2_ = uVar24;
    auVar36._18_2_ = uVar24;
    auVar36._20_2_ = uVar24;
    auVar36._22_2_ = uVar24;
    auVar36._24_2_ = uVar24;
    auVar36._26_2_ = uVar24;
    auVar36._28_2_ = uVar24;
    auVar36._30_2_ = uVar24;
    auVar1 = vpshufb_avx(auVar1,_DAT_0052acb0);
    uVar24 = auVar1._0_2_;
    auVar37._2_2_ = uVar24;
    auVar37._0_2_ = uVar24;
    auVar37._4_2_ = uVar24;
    auVar37._6_2_ = uVar24;
    auVar37._8_2_ = uVar24;
    auVar37._10_2_ = uVar24;
    auVar37._12_2_ = uVar24;
    auVar37._14_2_ = uVar24;
    auVar37._16_2_ = uVar24;
    auVar37._18_2_ = uVar24;
    auVar37._20_2_ = uVar24;
    auVar37._22_2_ = uVar24;
    auVar37._24_2_ = uVar24;
    auVar37._26_2_ = uVar24;
    auVar37._28_2_ = uVar24;
    auVar37._30_2_ = uVar24;
    uVar24 = (undefined2)(1 << (cVar11 - 1U & 0x1f));
    auVar47._2_2_ = uVar24;
    auVar47._0_2_ = uVar24;
    auVar47._4_2_ = uVar24;
    auVar47._6_2_ = uVar24;
    auVar47._8_2_ = uVar24;
    auVar47._10_2_ = uVar24;
    auVar47._12_2_ = uVar24;
    auVar47._14_2_ = uVar24;
    auVar47._16_2_ = uVar24;
    auVar47._18_2_ = uVar24;
    auVar47._20_2_ = uVar24;
    auVar47._22_2_ = uVar24;
    auVar47._24_2_ = uVar24;
    auVar47._26_2_ = uVar24;
    auVar47._28_2_ = uVar24;
    auVar47._30_2_ = uVar24;
    uVar24 = (undefined2)(1 << (0xeU - cVar11 & 0x1f));
    auVar48._2_2_ = uVar24;
    auVar48._0_2_ = uVar24;
    auVar48._4_2_ = uVar24;
    auVar48._6_2_ = uVar24;
    auVar48._8_2_ = uVar24;
    auVar48._10_2_ = uVar24;
    auVar48._12_2_ = uVar24;
    auVar48._14_2_ = uVar24;
    auVar48._16_2_ = uVar24;
    auVar48._18_2_ = uVar24;
    auVar48._20_2_ = uVar24;
    auVar48._22_2_ = uVar24;
    auVar48._24_2_ = uVar24;
    auVar48._26_2_ = uVar24;
    auVar48._28_2_ = uVar24;
    auVar48._30_2_ = uVar24;
    uVar25 = ~(ushort)(-1 << (0x10U - cVar11 & 0x1f));
    iVar21 = (-1 << (cVar2 + 7U & 0x1f)) + (1 << (cVar2 - 1U & 0x1f));
    auVar1 = vpaddw_avx(*(undefined1 (*) [16])filter_y,_DAT_00527960);
    auVar39 = ZEXT464((uint)conv_params->round_1);
    auVar35 = vpshufd_avx(auVar1,0xff);
    uVar29 = auVar35._0_8_;
    auVar41 = ZEXT3264(CONCAT824(uVar29,CONCAT816(uVar29,CONCAT88(uVar29,uVar29))));
    auVar35 = vpshufd_avx(auVar1,0xfa);
    uVar29 = auVar35._0_8_;
    auVar43 = ZEXT3264(CONCAT824(uVar29,CONCAT816(uVar29,CONCAT88(uVar29,uVar29))));
    auVar35 = vpshufd_avx(auVar1,0x55);
    uVar29 = auVar35._0_8_;
    auVar44._8_8_ = uVar29;
    auVar44._0_8_ = uVar29;
    auVar44._16_8_ = uVar29;
    auVar44._24_8_ = uVar29;
    uVar26 = auVar1._0_4_;
    auVar45._4_4_ = uVar26;
    auVar45._0_4_ = uVar26;
    auVar45._8_4_ = uVar26;
    auVar45._12_4_ = uVar26;
    auVar45._16_4_ = uVar26;
    auVar45._20_4_ = uVar26;
    auVar45._24_4_ = uVar26;
    auVar45._28_4_ = uVar26;
    puVar17 = src + src_stride * -2 + -3;
    uVar22 = 0;
    puVar23 = dst;
    do {
      if (-6 < h) {
        iVar4 = conv_params->round_0;
        pauVar18 = (undefined1 (*) [32])local_8e0;
        lVar13 = 0;
        lVar20 = 0;
        do {
          auVar1 = *(undefined1 (*) [16])(puVar14 + lVar13);
          auVar27._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
          auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
          if (lVar20 < h + 5) {
            auVar27._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(puVar17 + lVar13) + ZEXT116(1) * auVar27._0_16_
            ;
            auVar27._16_16_ =
                 ZEXT116(0) * auVar27._16_16_ +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar17 + lVar13);
          }
          auVar8 = vpshufb_avx2(auVar27,_DAT_004e0120);
          auVar8 = vpmaddubsw_avx2(auVar8,auVar33);
          auVar8 = vpaddw_avx2(auVar47,auVar8);
          auVar9 = vpshufb_avx2(auVar27,_DAT_004e00c0);
          auVar9 = vpmaddubsw_avx2(auVar9,auVar34);
          auVar10 = vpshufb_avx2(auVar27,_DAT_004e00e0);
          auVar10 = vpmaddubsw_avx2(auVar10,auVar36);
          auVar9 = vpaddw_avx2(auVar9,auVar10);
          auVar8 = vpaddw_avx2(auVar8,auVar9);
          auVar9 = vpshufb_avx2(auVar27,_DAT_0052b540);
          auVar9 = vpsllw_avx2(auVar9,ZEXT416(7 - iVar4));
          auVar27 = vpshufb_avx2(auVar27,_DAT_004e0140);
          auVar27 = vpmaddubsw_avx2(auVar27,auVar37);
          auVar27 = vpaddw_avx2(auVar8,auVar27);
          auVar8 = vpsraw_avx2(auVar27,ZEXT416(uVar3));
          auVar27 = vpaddw_avx2(auVar48,auVar9);
          auVar27 = vpaddw_avx2(auVar8,auVar27);
          auVar27 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar27);
          auVar8._2_2_ = uVar25;
          auVar8._0_2_ = uVar25;
          auVar8._4_2_ = uVar25;
          auVar8._6_2_ = uVar25;
          auVar8._8_2_ = uVar25;
          auVar8._10_2_ = uVar25;
          auVar8._12_2_ = uVar25;
          auVar8._14_2_ = uVar25;
          auVar8._16_2_ = uVar25;
          auVar8._18_2_ = uVar25;
          auVar8._20_2_ = uVar25;
          auVar8._22_2_ = uVar25;
          auVar8._24_2_ = uVar25;
          auVar8._26_2_ = uVar25;
          auVar8._28_2_ = uVar25;
          auVar8._30_2_ = uVar25;
          auVar27 = vpminsw_avx2(auVar27,auVar8);
          *pauVar18 = auVar27;
          lVar20 = lVar20 + 2;
          lVar13 = lVar13 + src_stride * 2;
          pauVar18 = pauVar18 + 1;
        } while (lVar20 < h + 6);
      }
      uVar19 = 0;
      auVar9._16_16_ = auStack_8d0;
      auVar9._0_16_ = local_8e0;
      auVar7._16_16_ = local_8c0;
      auVar7._0_16_ = auStack_8d0;
      auVar40._16_16_ = auStack_8b0;
      auVar40._0_16_ = local_8c0;
      auVar42._16_16_ = local_8a0;
      auVar42._0_16_ = auStack_8b0;
      auVar5._16_16_ = auStack_890;
      auVar5._0_16_ = local_8a0;
      auVar6._16_16_ = local_880;
      auVar6._0_16_ = auStack_890;
      auVar10 = vpunpcklwd_avx2(auVar9,auVar7);
      auVar31 = vpunpcklwd_avx2(auVar40,auVar42);
      auVar32 = vpunpcklwd_avx2(auVar5,auVar6);
      auVar27 = vpunpckhwd_avx2(auVar9,auVar7);
      auVar1 = auVar27._0_16_;
      auVar8 = vpunpckhwd_avx2(auVar40,auVar42);
      auVar46 = auVar8._0_16_;
      auVar9 = vpunpckhwd_avx2(auVar5,auVar6);
      auVar35 = auVar9._0_16_;
      if (1 < h) {
        pauVar18 = (undefined1 (*) [32])auStack_870;
        uVar19 = 0;
        auVar42 = auVar43._0_32_;
        auVar40 = auVar41._0_32_;
        auVar38 = auVar39._0_16_;
        auVar12._4_4_ = iVar21;
        auVar12._0_4_ = iVar21;
        auVar12._8_4_ = iVar21;
        auVar12._12_4_ = iVar21;
        auVar12._16_4_ = iVar21;
        auVar12._20_4_ = iVar21;
        auVar12._24_4_ = iVar21;
        auVar12._28_4_ = iVar21;
        puVar15 = puVar23;
        auVar7 = auVar10;
        do {
          auVar30 = auVar8;
          auVar10 = auVar31;
          auVar8 = auVar9;
          auVar31 = auVar32;
          auVar1 = auVar30._0_16_;
          auVar46 = auVar8._0_16_;
          auVar32 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar18[-1] + 0x10),*pauVar18);
          auVar9 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar18[-1] + 0x10),*pauVar18);
          auVar35 = auVar9._0_16_;
          auVar5 = vpmaddwd_avx2(auVar44,auVar10);
          auVar6 = vpmaddwd_avx2(auVar42,auVar31);
          auVar5 = vpaddd_avx2(auVar5,auVar6);
          auVar6 = vpmaddwd_avx2(auVar44,auVar30);
          auVar28 = vpmaddwd_avx2(auVar42,auVar8);
          auVar6 = vpaddd_avx2(auVar6,auVar28);
          auVar7 = vpmaddwd_avx2(auVar7,auVar45);
          auVar7 = vpaddd_avx2(auVar7,auVar12);
          auVar7 = vpaddd_avx2(auVar7,auVar5);
          auVar5 = vpmaddwd_avx2(auVar40,auVar32);
          auVar28 = vpmaddwd_avx2(auVar45,auVar27);
          auVar27 = vpaddd_avx2(auVar5,auVar7);
          auVar7 = vpmaddwd_avx2(auVar40,auVar9);
          auVar5 = vpsrad_avx2(auVar27,auVar38);
          auVar27 = vpaddd_avx2(auVar12,auVar28);
          auVar27 = vpaddd_avx2(auVar27,auVar6);
          auVar27 = vpaddd_avx2(auVar7,auVar27);
          auVar27 = vpsrad_avx2(auVar27,auVar38);
          auVar27 = vpackssdw_avx2(auVar5,auVar27);
          auVar27 = vpackuswb_avx2(auVar27,auVar27);
          *(long *)puVar15 = auVar27._0_8_;
          *(long *)(puVar15 + dst_stride) = auVar27._16_8_;
          uVar19 = uVar19 + 2;
          pauVar18 = pauVar18 + 1;
          puVar15 = puVar15 + dst_stride * 2;
          auVar7 = auVar10;
          auVar27 = auVar30;
        } while ((long)uVar19 < (long)(h + -1));
        auVar39 = ZEXT1664(auVar38);
        auVar41 = ZEXT3264(auVar40);
        auVar43 = ZEXT3264(auVar42);
      }
      if ((int)uVar19 != h) {
        auVar28._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar10._0_16_;
        auVar28._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar1;
        auVar30._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar31._0_16_;
        auVar30._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar46;
        auVar31._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar32._0_16_;
        auVar31._16_16_ = ZEXT116(0) * auVar32._16_16_ + ZEXT116(1) * auVar35;
        uVar16 = (ulong)(uint)((int)uVar19 * 8);
        auVar1 = *(undefined1 (*) [16])((long)auStack_870 + uVar16 * 2);
        auVar35 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_880 + uVar16 * 2),auVar1);
        auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_880 + uVar16 * 2),auVar1);
        auVar32._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar35;
        auVar32._16_16_ = ZEXT116(1) * auVar1;
        auVar8 = vpmaddwd_avx2(auVar45,auVar28);
        auVar27 = vpmaddwd_avx2(auVar44,auVar30);
        auVar9 = vpmaddwd_avx2(auVar43._0_32_,auVar31);
        auVar27 = vpaddd_avx2(auVar27,auVar9);
        auVar9 = vpmaddwd_avx2(auVar41._0_32_,auVar32);
        auVar10._4_4_ = iVar21;
        auVar10._0_4_ = iVar21;
        auVar10._8_4_ = iVar21;
        auVar10._12_4_ = iVar21;
        auVar10._16_4_ = iVar21;
        auVar10._20_4_ = iVar21;
        auVar10._24_4_ = iVar21;
        auVar10._28_4_ = iVar21;
        auVar8 = vpaddd_avx2(auVar8,auVar10);
        auVar27 = vpaddd_avx2(auVar8,auVar27);
        auVar27 = vpaddd_avx2(auVar27,auVar9);
        auVar27 = vpsrad_avx2(auVar27,auVar39._0_16_);
        auVar1 = vpackusdw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar1 = vpackuswb_avx(auVar1,auVar1);
        *(long *)(dst + uVar22 + (uVar19 & 0xffffffff) * dst_stride) = auVar1._0_8_;
      }
      uVar22 = uVar22 + 8;
      puVar17 = puVar17 + 8;
      puVar14 = puVar14 + 8;
      puVar23 = puVar23 + 8;
    } while (uVar22 < (uint)w);
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_avx2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + SUBPEL_TAPS) * 8]);
  int im_h = h + SUBPEL_TAPS - 2;
  int im_stride = 8;
  memset(im_block + (im_h * im_stride), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = (SUBPEL_TAPS - 1) / 2;
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  __m256i filt[4], coeffs_h[4], coeffs_v[4], filt_center;

  assert(conv_params->round_0 > 0);

  filt[0] = _mm256_load_si256((__m256i const *)filt1_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)filt2_global_avx2);
  filt[2] = _mm256_load_si256((__m256i const *)filt3_global_avx2);
  filt[3] = _mm256_load_si256((__m256i const *)filt4_global_avx2);

  filt_center = _mm256_load_si256((__m256i const *)filt_center_global_avx2);

  const __m128i coeffs_x = _mm_loadu_si128((__m128i *)filter_x);
  const __m256i filter_coeffs_x = _mm256_broadcastsi128_si256(coeffs_x);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_h[0] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_h[1] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_h[2] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_h[3] =
      _mm256_shuffle_epi8(filter_coeffs_x, _mm256_set1_epi16(0x0e0cu));

  const __m256i round_const_h =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)));
  const __m256i round_const_horz =
      _mm256_set1_epi16((1 << (bd + FILTER_BITS - conv_params->round_0 - 1)));
  const __m256i clamp_low = _mm256_setzero_si256();
  const __m256i clamp_high =
      _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0);

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i zero_128 = _mm_setzero_si128();
  const __m128i offset_0 = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);
  const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset_0);

  const __m256i filter_coeffs_y = _mm256_broadcastsi128_si256(coeffs_y);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs_v[0] = _mm256_shuffle_epi32(filter_coeffs_y, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs_v[1] = _mm256_shuffle_epi32(filter_coeffs_y, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs_v[2] = _mm256_shuffle_epi32(filter_coeffs_y, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs_v[3] = _mm256_shuffle_epi32(filter_coeffs_y, 0xff);

  const __m256i round_const_v =
      _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                        (1 << (bd + conv_params->round_1 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  for (j = 0; j < w; j += 8) {
    for (i = 0; i < im_h; i += 2) {
      __m256i data = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)&src_ptr[(i * src_stride) + j]));

      // Load the next line
      if (i + 1 < im_h)
        data = _mm256_inserti128_si256(
            data,
            _mm_loadu_si128(
                (__m128i *)&src_ptr[(i * src_stride) + j + src_stride]),
            1);

      __m256i res = convolve_lowbd_x(data, coeffs_h, filt);

      res =
          _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h), round_shift_h);

      __m256i data_0 = _mm256_shuffle_epi8(data, filt_center);

      // multiply the center pixel by 2^(FILTER_BITS - round_0) and add it to
      // the result
      data_0 = _mm256_slli_epi16(data_0, FILTER_BITS - conv_params->round_0);
      res = _mm256_add_epi16(res, data_0);
      res = _mm256_add_epi16(res, round_const_horz);
      const __m256i res_clamped =
          _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high);
      _mm256_store_si256((__m256i *)&im_block[i * im_stride], res_clamped);
    }

    /* Vertical filter */
    {
      __m256i src_0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i src_1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i src_2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i src_3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i src_4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i src_5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      __m256i s[8];
      s[0] = _mm256_unpacklo_epi16(src_0, src_1);
      s[1] = _mm256_unpacklo_epi16(src_2, src_3);
      s[2] = _mm256_unpacklo_epi16(src_4, src_5);

      s[4] = _mm256_unpackhi_epi16(src_0, src_1);
      s[5] = _mm256_unpackhi_epi16(src_2, src_3);
      s[6] = _mm256_unpackhi_epi16(src_4, src_5);

      for (i = 0; i < h - 1; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        __m256i res_a = convolve(s, coeffs_v);
        __m256i res_b = convolve(s + 4, coeffs_v);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);
        const __m256i res_b_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_b, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        const __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
        // 8 bit conversion and saturation to uint8
        const __m256i res_8b = _mm256_packus_epi16(res_16bit, res_16bit);

        const __m128i res_0 = _mm256_castsi256_si128(res_8b);
        const __m128i res_1 = _mm256_extracti128_si256(res_8b, 1);

        // Store values into the destination buffer
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        __m128i *const p_1 = (__m128i *)&dst[i * dst_stride + j + dst_stride];

        _mm_storel_epi64(p_0, res_0);
        _mm_storel_epi64(p_1, res_1);

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
      if (h - i) {
        s[0] = _mm256_permute2x128_si256(s[0], s[4], 0x20);
        s[1] = _mm256_permute2x128_si256(s[1], s[5], 0x20);
        s[2] = _mm256_permute2x128_si256(s[2], s[6], 0x20);

        const int16_t *data = &im_block[i * im_stride];
        const __m128i s6_ = _mm_loadu_si128((__m128i *)(data + 6 * im_stride));
        const __m128i s7_ = _mm_loadu_si128((__m128i *)(data + 7 * im_stride));

        __m128i s3 = _mm_unpacklo_epi16(s6_, s7_);
        __m128i s7 = _mm_unpackhi_epi16(s6_, s7_);

        s[3] = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s7, 1);
        __m256i convolveres = convolve(s, coeffs_v);

        const __m256i res_round = _mm256_sra_epi32(
            _mm256_add_epi32(convolveres, round_const_v), round_shift_v);

        /* rounding code */
        // 16 bit conversion
        __m128i reslo = _mm256_castsi256_si128(res_round);
        __m128i reshi = _mm256_extracti128_si256(res_round, 1);
        const __m128i res_16bit = _mm_packus_epi32(reslo, reshi);

        // 8 bit conversion and saturation to uint8
        const __m128i res_8b = _mm_packus_epi16(res_16bit, res_16bit);
        __m128i *const p_0 = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p_0, res_8b);
      }
    }
  }
}